

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

void __thiscall dg::llvmdg::legacy::Function::~Function(Function *this)

{
  Block *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(Block **)(p_Var1 + 1);
    if (this_00 != (Block *)0x0) {
      Block::~Block(this_00);
    }
    operator_delete(this_00,0x118);
  }
  std::
  _Rb_tree<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::Block_*,_std::_Identity<dg::llvmdg::legacy::Block_*>,_std::less<dg::llvmdg::legacy::Block_*>,_std::allocator<dg::llvmdg::legacy::Block_*>_>
  ::~_Rb_tree(&(this->blocks)._M_t);
  return;
}

Assistant:

Function::~Function() {
    for (auto *block : blocks) {
        delete block;
    }
}